

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprCodeIN(Parse *pParse,Expr *pExpr,int destIfFalse,int destIfNull)

{
  Expr *pEVar1;
  Vdbe *p;
  ExprList *pEVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  byte *p_00;
  Select *pSVar12;
  int *aiMap;
  Expr *pEVar13;
  CollSeq *zP4;
  u8 uVar14;
  int *piVar15;
  Op *pOVar16;
  ulong uVar17;
  ExprList_item *pEVar18;
  uint i;
  long lVar19;
  int rRhsHasNull;
  int regToFree;
  int iDummy;
  uint local_80;
  int local_50;
  int local_4c;
  byte *local_48;
  Expr *local_40;
  int local_38;
  int local_34;
  
  local_4c = 0;
  pEVar13 = pExpr->pLeft;
  iVar4 = sqlite3ExprCheckIN(pParse,pExpr);
  if (iVar4 != 0) {
    return;
  }
  p_00 = (byte *)exprINAffinity(pParse,pExpr);
  pEVar1 = pExpr->pLeft;
  uVar14 = pEVar1->op;
  if (uVar14 == 0xa4) {
    uVar14 = pEVar1->op2;
  }
  if (uVar14 == '\x7f') {
    pSVar12 = (pEVar1->x).pSelect;
LAB_00154f16:
    uVar7 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar12->pEList)->pList->nExpr;
  }
  else {
    uVar7 = 1;
    if (uVar14 == 0xa5) {
      pSVar12 = (Select *)&pEVar1->x;
      goto LAB_00154f16;
    }
  }
  aiMap = (int *)sqlite3DbMallocZero(pParse->db,(long)(int)uVar7 * 5 + 1);
  if (pParse->db->mallocFailed != '\0') goto LAB_0015567a;
  p = pParse->pVdbe;
  piVar15 = &local_4c;
  if (destIfFalse == destIfNull) {
    piVar15 = (int *)0x0;
  }
  local_48 = p_00;
  iVar5 = sqlite3FindInIndex(pParse,pExpr,3,piVar15,aiMap);
  local_40 = pEVar13;
  iVar6 = exprCodeVector(pParse,pEVar13,&local_34);
  iVar4 = iVar6;
  if ((int)uVar7 < 1) {
    if (uVar7 != 0) {
      iVar4 = sqlite3GetTempRange(pParse,uVar7);
    }
  }
  else {
    uVar17 = 0;
    do {
      if (uVar17 != (uint)aiMap[uVar17]) {
        if ((uVar7 != (uint)uVar17) && (iVar4 = sqlite3GetTempRange(pParse,uVar7), 0 < (int)uVar7))
        {
          uVar17 = 0;
          do {
            sqlite3VdbeAddOp3(p,0x4e,iVar6 + (int)uVar17,aiMap[uVar17] + iVar4,0);
            uVar17 = uVar17 + 1;
          } while (uVar7 != uVar17);
        }
        break;
      }
      uVar17 = uVar17 + 1;
    } while (uVar7 != uVar17);
  }
  if (iVar5 == 5) {
    pEVar2 = (pExpr->x).pList;
    local_40 = (Expr *)sqlite3ExprCollSeq(pParse,pExpr->pLeft);
    uVar7 = sqlite3VdbeMakeLabel((Vdbe *)p->pParse);
    iVar5 = 0;
    if (destIfFalse != destIfNull) {
      if (pParse->nTempReg == '\0') {
        iVar5 = pParse->nMem + 1;
        pParse->nMem = iVar5;
      }
      else {
        bVar3 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar3;
        iVar5 = pParse->aTempReg[bVar3];
      }
      sqlite3VdbeAddOp3(p,0x5c,iVar4,iVar4,iVar5);
    }
    if (0 < pEVar2->nExpr) {
      pEVar18 = pEVar2->a;
      lVar19 = 0;
      do {
        iVar10 = sqlite3ExprCodeTemp(pParse,pEVar18->pExpr,&local_38);
        if ((iVar5 != 0) && (iVar11 = sqlite3ExprCanBeNull(pEVar18->pExpr), iVar11 != 0)) {
          sqlite3VdbeAddOp3(p,0x5c,iVar5,iVar10,iVar5);
        }
        if ((destIfFalse == destIfNull) && ((long)pEVar2->nExpr + -1 <= lVar19)) {
          iVar10 = sqlite3VdbeAddOp3(p,0x34,iVar4,destIfFalse,iVar10);
          sqlite3VdbeChangeP4(p,iVar10,(char *)local_40,-2);
          uVar8 = p->nOp;
          if (0 < (int)uVar8) {
            bVar3 = *local_48 | 0x10;
LAB_001552f5:
            p->aOp[(ulong)uVar8 - 1].p5 = (short)(char)bVar3;
          }
        }
        else {
          iVar10 = sqlite3VdbeAddOp3(p,0x35,iVar4,uVar7,iVar10);
          sqlite3VdbeChangeP4(p,iVar10,(char *)local_40,-2);
          uVar8 = p->nOp;
          if (0 < (int)uVar8) {
            bVar3 = *local_48;
            goto LAB_001552f5;
          }
        }
        if (local_38 != 0) {
          bVar3 = pParse->nTempReg;
          if ((ulong)bVar3 < 8) {
            pParse->nTempReg = bVar3 + 1;
            pParse->aTempReg[bVar3] = local_38;
          }
        }
        lVar19 = lVar19 + 1;
        pEVar18 = pEVar18 + 1;
      } while (lVar19 < pEVar2->nExpr);
    }
    if (iVar5 == 0) {
      piVar15 = p->pParse->aLabel;
      if (piVar15 != (int *)0x0) {
        piVar15[(int)~uVar7] = p->nOp;
      }
    }
    else {
      sqlite3VdbeAddOp3(p,0x32,iVar5,destIfNull,0);
      sqlite3VdbeAddOp3(p,0xb,0,destIfFalse,0);
      piVar15 = p->pParse->aLabel;
      if (piVar15 != (int *)0x0) {
        piVar15[(int)~uVar7] = p->nOp;
      }
      bVar3 = pParse->nTempReg;
      if ((ulong)bVar3 < 8) {
        pParse->nTempReg = bVar3 + 1;
        pParse->aTempReg[bVar3] = iVar5;
      }
    }
  }
  else {
    uVar8 = destIfFalse;
    uVar9 = 0;
    if (destIfFalse != destIfNull) {
      uVar8 = sqlite3VdbeMakeLabel((Vdbe *)p->pParse);
      uVar9 = uVar8;
    }
    if (0 < (int)uVar7) {
      i = 0;
      do {
        pEVar13 = sqlite3VectorFieldSubexpr(pExpr->pLeft,i);
        iVar10 = sqlite3ExprCanBeNull(pEVar13);
        if (iVar10 != 0) {
          sqlite3VdbeAddOp3(p,0x32,iVar4 + i,uVar8,0);
        }
        i = i + 1;
      } while (uVar7 != i);
    }
    if (iVar5 == 1) {
      sqlite3VdbeAddOp3(p,0x1e,pExpr->iTable,destIfFalse,iVar4);
      local_50 = sqlite3VdbeAddOp3(p,0xb,0,0,0);
    }
    else {
      iVar5 = sqlite3VdbeAddOp3(p,0x5b,iVar4,uVar7,0);
      sqlite3VdbeChangeP4(p,iVar5,(char *)local_48,uVar7);
      if (destIfFalse == destIfNull) {
        iVar5 = sqlite3VdbeAddOp3(p,0x1c,pExpr->iTable,destIfFalse,iVar4);
        if (p->db->mallocFailed == '\0') {
          pOVar16 = p->aOp;
          pOVar16[iVar5].p4type = -3;
          pOVar16[iVar5].p4.i = uVar7;
        }
        goto LAB_0015564d;
      }
      local_50 = sqlite3VdbeAddOp3(p,0x1d,pExpr->iTable,0,iVar4);
      if (p->db->mallocFailed == '\0') {
        pOVar16 = p->aOp;
        pOVar16[local_50].p4type = -3;
        pOVar16[local_50].p4.i = uVar7;
      }
    }
    if (uVar7 == 1 && local_4c != 0) {
      sqlite3VdbeAddOp3(p,0x33,local_4c,destIfFalse,0);
    }
    if (destIfFalse == destIfNull) {
      sqlite3VdbeAddOp3(p,0xb,0,destIfFalse,0);
    }
    if ((uVar9 != 0) && (piVar15 = p->pParse->aLabel, piVar15 != (int *)0x0)) {
      piVar15[(int)~uVar9] = p->nOp;
    }
    iVar5 = sqlite3VdbeAddOp3(p,0x24,pExpr->iTable,destIfFalse,0);
    if ((int)uVar7 < 2) {
      local_80 = destIfFalse;
      if (0 < (int)uVar7) goto LAB_001554c9;
      sqlite3VdbeAddOp3(p,0xb,0,destIfNull,0);
    }
    else {
      local_80 = sqlite3VdbeMakeLabel((Vdbe *)p->pParse);
LAB_001554c9:
      uVar8 = 0;
      do {
        if (pParse->nTempReg == '\0') {
          iVar10 = pParse->nMem + 1;
          pParse->nMem = iVar10;
        }
        else {
          bVar3 = pParse->nTempReg - 1;
          pParse->nTempReg = bVar3;
          iVar10 = pParse->aTempReg[bVar3];
        }
        pEVar13 = sqlite3VectorFieldSubexpr(local_40,uVar8);
        zP4 = sqlite3ExprCollSeq(pParse,pEVar13);
        sqlite3VdbeAddOp3(p,0x5a,pExpr->iTable,uVar8,iVar10);
        iVar11 = sqlite3VdbeAddOp3(p,0x34,iVar4 + uVar8,local_80,iVar10);
        sqlite3VdbeChangeP4(p,iVar11,(char *)zP4,-2);
        if (iVar10 != 0) {
          bVar3 = pParse->nTempReg;
          if ((ulong)bVar3 < 8) {
            pParse->nTempReg = bVar3 + 1;
            pParse->aTempReg[bVar3] = iVar10;
          }
        }
        uVar8 = uVar8 + 1;
      } while (uVar7 != uVar8);
      sqlite3VdbeAddOp3(p,0xb,0,destIfNull,0);
      if (1 < (int)uVar7) {
        piVar15 = p->pParse->aLabel;
        if (piVar15 != (int *)0x0) {
          piVar15[(int)~local_80] = p->nOp;
        }
        sqlite3VdbeAddOp3(p,5,pExpr->iTable,iVar5 + 1,0);
        sqlite3VdbeAddOp3(p,0xb,0,destIfFalse,0);
      }
    }
    if (p->db->mallocFailed == '\0') {
      iVar5 = p->nOp + -1;
      if (-1 < local_50) {
        iVar5 = local_50;
      }
      pOVar16 = p->aOp + iVar5;
    }
    else {
      pOVar16 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar16->p2 = p->nOp;
  }
LAB_0015564d:
  p_00 = local_48;
  if (iVar4 != 0 && iVar4 != iVar6) {
    bVar3 = pParse->nTempReg;
    if ((ulong)bVar3 < 8) {
      pParse->nTempReg = bVar3 + 1;
      pParse->aTempReg[bVar3] = iVar4;
    }
  }
LAB_0015567a:
  if (aiMap != (int *)0x0) {
    sqlite3DbFreeNN(pParse->db,aiMap);
  }
  if (p_00 != (byte *)0x0) {
    sqlite3DbFreeNN(pParse->db,p_00);
  }
  return;
}

Assistant:

static void sqlite3ExprCodeIN(
  Parse *pParse,        /* Parsing and code generating context */
  Expr *pExpr,          /* The IN expression */
  int destIfFalse,      /* Jump here if LHS is not contained in the RHS */
  int destIfNull        /* Jump here if the results are unknown due to NULLs */
){
  int rRhsHasNull = 0;  /* Register that is true if RHS contains NULL values */
  int eType;            /* Type of the RHS */
  int rLhs;             /* Register(s) holding the LHS values */
  int rLhsOrig;         /* LHS values prior to reordering by aiMap[] */
  Vdbe *v;              /* Statement under construction */
  int *aiMap = 0;       /* Map from vector field to index column */
  char *zAff = 0;       /* Affinity string for comparisons */
  int nVector;          /* Size of vectors for this IN operator */
  int iDummy;           /* Dummy parameter to exprCodeVector() */
  Expr *pLeft;          /* The LHS of the IN operator */
  int i;                /* loop counter */
  int destStep2;        /* Where to jump when NULLs seen in step 2 */
  int destStep6 = 0;    /* Start of code for Step 6 */
  int addrTruthOp;      /* Address of opcode that determines the IN is true */
  int destNotNull;      /* Jump here if a comparison is not true in step 6 */
  int addrTop;          /* Top of the step-6 loop */ 

  pLeft = pExpr->pLeft;
  if( sqlite3ExprCheckIN(pParse, pExpr) ) return;
  zAff = exprINAffinity(pParse, pExpr);
  nVector = sqlite3ExprVectorSize(pExpr->pLeft);
  aiMap = (int*)sqlite3DbMallocZero(
      pParse->db, nVector*(sizeof(int) + sizeof(char)) + 1
  );
  if( pParse->db->mallocFailed ) goto sqlite3ExprCodeIN_oom_error;

  /* Attempt to compute the RHS. After this step, if anything other than
  ** IN_INDEX_NOOP is returned, the table opened ith cursor pExpr->iTable 
  ** contains the values that make up the RHS. If IN_INDEX_NOOP is returned,
  ** the RHS has not yet been coded.  */
  v = pParse->pVdbe;
  assert( v!=0 );       /* OOM detected prior to this routine */
  VdbeNoopComment((v, "begin IN expr"));
  eType = sqlite3FindInIndex(pParse, pExpr,
                             IN_INDEX_MEMBERSHIP | IN_INDEX_NOOP_OK,
                             destIfFalse==destIfNull ? 0 : &rRhsHasNull, aiMap);

  assert( pParse->nErr || nVector==1 || eType==IN_INDEX_EPH
       || eType==IN_INDEX_INDEX_ASC || eType==IN_INDEX_INDEX_DESC 
  );
#ifdef SQLITE_DEBUG
  /* Confirm that aiMap[] contains nVector integer values between 0 and
  ** nVector-1. */
  for(i=0; i<nVector; i++){
    int j, cnt;
    for(cnt=j=0; j<nVector; j++) if( aiMap[j]==i ) cnt++;
    assert( cnt==1 );
  }
#endif

  /* Code the LHS, the <expr> from "<expr> IN (...)". If the LHS is a 
  ** vector, then it is stored in an array of nVector registers starting 
  ** at r1.
  **
  ** sqlite3FindInIndex() might have reordered the fields of the LHS vector
  ** so that the fields are in the same order as an existing index.   The
  ** aiMap[] array contains a mapping from the original LHS field order to
  ** the field order that matches the RHS index.
  */
  rLhsOrig = exprCodeVector(pParse, pLeft, &iDummy);
  for(i=0; i<nVector && aiMap[i]==i; i++){} /* Are LHS fields reordered? */
  if( i==nVector ){
    /* LHS fields are not reordered */
    rLhs = rLhsOrig;
  }else{
    /* Need to reorder the LHS fields according to aiMap */
    rLhs = sqlite3GetTempRange(pParse, nVector);
    for(i=0; i<nVector; i++){
      sqlite3VdbeAddOp3(v, OP_Copy, rLhsOrig+i, rLhs+aiMap[i], 0);
    }
  }

  /* If sqlite3FindInIndex() did not find or create an index that is
  ** suitable for evaluating the IN operator, then evaluate using a
  ** sequence of comparisons.
  **
  ** This is step (1) in the in-operator.md optimized algorithm.
  */
  if( eType==IN_INDEX_NOOP ){
    ExprList *pList = pExpr->x.pList;
    CollSeq *pColl = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
    int labelOk = sqlite3VdbeMakeLabel(v);
    int r2, regToFree;
    int regCkNull = 0;
    int ii;
    assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
    if( destIfNull!=destIfFalse ){
      regCkNull = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_BitAnd, rLhs, rLhs, regCkNull);
    }
    for(ii=0; ii<pList->nExpr; ii++){
      r2 = sqlite3ExprCodeTemp(pParse, pList->a[ii].pExpr, &regToFree);
      if( regCkNull && sqlite3ExprCanBeNull(pList->a[ii].pExpr) ){
        sqlite3VdbeAddOp3(v, OP_BitAnd, regCkNull, r2, regCkNull);
      }
      if( ii<pList->nExpr-1 || destIfNull!=destIfFalse ){
        sqlite3VdbeAddOp4(v, OP_Eq, rLhs, labelOk, r2,
                          (void*)pColl, P4_COLLSEQ);
        VdbeCoverageIf(v, ii<pList->nExpr-1);
        VdbeCoverageIf(v, ii==pList->nExpr-1);
        sqlite3VdbeChangeP5(v, zAff[0]);
      }else{
        assert( destIfNull==destIfFalse );
        sqlite3VdbeAddOp4(v, OP_Ne, rLhs, destIfFalse, r2,
                          (void*)pColl, P4_COLLSEQ); VdbeCoverage(v);
        sqlite3VdbeChangeP5(v, zAff[0] | SQLITE_JUMPIFNULL);
      }
      sqlite3ReleaseTempReg(pParse, regToFree);
    }
    if( regCkNull ){
      sqlite3VdbeAddOp2(v, OP_IsNull, regCkNull, destIfNull); VdbeCoverage(v);
      sqlite3VdbeGoto(v, destIfFalse);
    }
    sqlite3VdbeResolveLabel(v, labelOk);
    sqlite3ReleaseTempReg(pParse, regCkNull);
    goto sqlite3ExprCodeIN_finished;
  }

  /* Step 2: Check to see if the LHS contains any NULL columns.  If the
  ** LHS does contain NULLs then the result must be either FALSE or NULL.
  ** We will then skip the binary search of the RHS.
  */
  if( destIfNull==destIfFalse ){
    destStep2 = destIfFalse;
  }else{
    destStep2 = destStep6 = sqlite3VdbeMakeLabel(v);
  }
  for(i=0; i<nVector; i++){
    Expr *p = sqlite3VectorFieldSubexpr(pExpr->pLeft, i);
    if( sqlite3ExprCanBeNull(p) ){
      sqlite3VdbeAddOp2(v, OP_IsNull, rLhs+i, destStep2);
      VdbeCoverage(v);
    }
  }

  /* Step 3.  The LHS is now known to be non-NULL.  Do the binary search
  ** of the RHS using the LHS as a probe.  If found, the result is
  ** true.
  */
  if( eType==IN_INDEX_ROWID ){
    /* In this case, the RHS is the ROWID of table b-tree and so we also
    ** know that the RHS is non-NULL.  Hence, we combine steps 3 and 4
    ** into a single opcode. */
    sqlite3VdbeAddOp3(v, OP_SeekRowid, pExpr->iTable, destIfFalse, rLhs);
    VdbeCoverage(v);
    addrTruthOp = sqlite3VdbeAddOp0(v, OP_Goto);  /* Return True */
  }else{
    sqlite3VdbeAddOp4(v, OP_Affinity, rLhs, nVector, 0, zAff, nVector);
    if( destIfFalse==destIfNull ){
      /* Combine Step 3 and Step 5 into a single opcode */
      sqlite3VdbeAddOp4Int(v, OP_NotFound, pExpr->iTable, destIfFalse,
                           rLhs, nVector); VdbeCoverage(v);
      goto sqlite3ExprCodeIN_finished;
    }
    /* Ordinary Step 3, for the case where FALSE and NULL are distinct */
    addrTruthOp = sqlite3VdbeAddOp4Int(v, OP_Found, pExpr->iTable, 0,
                                      rLhs, nVector); VdbeCoverage(v);
  }

  /* Step 4.  If the RHS is known to be non-NULL and we did not find
  ** an match on the search above, then the result must be FALSE.
  */
  if( rRhsHasNull && nVector==1 ){
    sqlite3VdbeAddOp2(v, OP_NotNull, rRhsHasNull, destIfFalse);
    VdbeCoverage(v);
  }

  /* Step 5.  If we do not care about the difference between NULL and
  ** FALSE, then just return false. 
  */
  if( destIfFalse==destIfNull ) sqlite3VdbeGoto(v, destIfFalse);

  /* Step 6: Loop through rows of the RHS.  Compare each row to the LHS.
  ** If any comparison is NULL, then the result is NULL.  If all
  ** comparisons are FALSE then the final result is FALSE.
  **
  ** For a scalar LHS, it is sufficient to check just the first row
  ** of the RHS.
  */
  if( destStep6 ) sqlite3VdbeResolveLabel(v, destStep6);
  addrTop = sqlite3VdbeAddOp2(v, OP_Rewind, pExpr->iTable, destIfFalse);
  VdbeCoverage(v);
  if( nVector>1 ){
    destNotNull = sqlite3VdbeMakeLabel(v);
  }else{
    /* For nVector==1, combine steps 6 and 7 by immediately returning
    ** FALSE if the first comparison is not NULL */
    destNotNull = destIfFalse;
  }
  for(i=0; i<nVector; i++){
    Expr *p;
    CollSeq *pColl;
    int r3 = sqlite3GetTempReg(pParse);
    p = sqlite3VectorFieldSubexpr(pLeft, i);
    pColl = sqlite3ExprCollSeq(pParse, p);
    sqlite3VdbeAddOp3(v, OP_Column, pExpr->iTable, i, r3);
    sqlite3VdbeAddOp4(v, OP_Ne, rLhs+i, destNotNull, r3,
                      (void*)pColl, P4_COLLSEQ);
    VdbeCoverage(v);
    sqlite3ReleaseTempReg(pParse, r3);
  }
  sqlite3VdbeAddOp2(v, OP_Goto, 0, destIfNull);
  if( nVector>1 ){
    sqlite3VdbeResolveLabel(v, destNotNull);
    sqlite3VdbeAddOp2(v, OP_Next, pExpr->iTable, addrTop+1);
    VdbeCoverage(v);

    /* Step 7:  If we reach this point, we know that the result must
    ** be false. */
    sqlite3VdbeAddOp2(v, OP_Goto, 0, destIfFalse);
  }

  /* Jumps here in order to return true. */
  sqlite3VdbeJumpHere(v, addrTruthOp);

sqlite3ExprCodeIN_finished:
  if( rLhs!=rLhsOrig ) sqlite3ReleaseTempReg(pParse, rLhs);
  VdbeComment((v, "end IN expr"));
sqlite3ExprCodeIN_oom_error:
  sqlite3DbFree(pParse->db, aiMap);
  sqlite3DbFree(pParse->db, zAff);
}